

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

float __thiscall
crnlib::adaptive_arith_data_model::get_cost(adaptive_arith_data_model *this,uint sym)

{
  uint bit_00;
  adaptive_bit_model *this_00;
  uint in_ESI;
  uint *in_RDI;
  float fVar1;
  uint bit;
  float cost;
  uint bitmask;
  uint node;
  float local_18;
  uint local_14;
  uint local_10;
  
  local_10 = 1;
  local_14 = *in_RDI;
  local_18 = 0.0;
  do {
    local_14 = local_14 >> 1;
    bit_00 = (uint)((in_ESI & local_14) != 0);
    this_00 = vector<crnlib::adaptive_bit_model>::operator[]
                        ((vector<crnlib::adaptive_bit_model> *)(in_RDI + 2),local_10);
    fVar1 = adaptive_bit_model::get_cost(this_00,bit_00);
    local_18 = fVar1 + local_18;
    local_10 = local_10 * 2 + bit_00;
  } while (1 < local_14);
  return local_18;
}

Assistant:

float adaptive_arith_data_model::get_cost(uint sym) const {
  uint node = 1;

  uint bitmask = m_total_syms;

  float cost = 0.0f;
  do {
    bitmask >>= 1;

    uint bit = (sym & bitmask) ? 1 : 0;
    cost += m_probs[node].get_cost(bit);
    node = (node << 1) + bit;

  } while (bitmask > 1);

  return cost;
}